

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O3

int GPU_GetNumActiveRenderers(void)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  gpu_init_renderer_register();
  lVar1 = 0;
  iVar2 = 0;
  iVar3 = 0;
  do {
    iVar2 = (iVar2 - (uint)(*(int *)((long)_gpu_renderer_map + lVar1) == 0 &&
                           *(int *)((long)_gpu_renderer_map + lVar1 + 4) == 0)) + 1;
    iVar3 = (iVar3 - (uint)(*(int *)((long)_gpu_renderer_map + lVar1 + 8) == 0 &&
                           *(int *)((long)_gpu_renderer_map + lVar1 + 0xc) == 0)) + 1;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xa0);
  return iVar3 + iVar2;
}

Assistant:

int GPU_GetNumActiveRenderers(void)
{
	int count;
	int i;

	gpu_init_renderer_register();

	count = 0;
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] != NULL)
			count++;
	}
	return count;
}